

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall cmm::InfixOpExprAST::dump(InfixOpExprAST *this,string *prefix)

{
  ExpressionAST *pEVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->Symbol);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  std::operator<<(poVar2,"|---");
  pEVar1 = (this->LHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  std::operator+(&local_40,prefix,"|   ");
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)prefix);
  std::operator<<(poVar2,"`---");
  pEVar1 = (this->RHS)._M_t.
           super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  std::operator+(&local_40,prefix,"    ");
  (*(pEVar1->super_AST)._vptr_AST[2])(pEVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void InfixOpExprAST::dump(const std::string &prefix) const {
  std::cout << getSymbol() << "\n";

  std::cout << prefix << "|---";
  LHS->dump(prefix + "|   ");

  std::cout << prefix << "`---";
  RHS->dump(prefix + "    ");
}